

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O3

int lgx_co_suspend(lgx_vm_t *vm)

{
  lgx_co_t *plVar1;
  lgx_list_s *plVar2;
  
  plVar1 = vm->co_running;
  if (plVar1 == (lgx_co_t *)0x0) {
    __assert_fail("vm->co_running",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/interpreter/coroutine.c"
                  ,0xe1,"int lgx_co_suspend(lgx_vm_t *)");
  }
  plVar1->status = CO_SUSPEND;
  if (plVar1->on_yield != (_func_int_lgx_vm_t_ptr *)0x0) {
    (*plVar1->on_yield)(vm);
    if (vm->co_running != plVar1) goto LAB_0012780e;
  }
  vm->co_running = (lgx_co_t *)0x0;
LAB_0012780e:
  plVar2 = (vm->co_suspend).prev;
  (vm->co_suspend).prev = &plVar1->head;
  (plVar1->head).next = &vm->co_suspend;
  (plVar1->head).prev = plVar2;
  plVar2->next = &plVar1->head;
  return 0;
}

Assistant:

int lgx_co_suspend(lgx_vm_t *vm) {
    assert(vm->co_running);

    lgx_co_t *co = vm->co_running;
    co->status = CO_SUSPEND;

    if (co->on_yield) {
        co->on_yield(vm);
    }

    if (vm->co_running == co) {
        vm->co_running = NULL;
    }
    lgx_list_add_tail(&co->head, &vm->co_suspend);

    return 0;
}